

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::Model::MergePartialFromCodedStream(Model *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint32 uVar8;
  ModelDescription *this_00;
  unsigned_long uVar9;
  PipelineClassifier *this_01;
  ArrayFeatureExtractor *this_02;
  DictVectorizer *this_03;
  Imputer *this_04;
  Normalizer *this_05;
  OneHotEncoder *this_06;
  CategoricalMapping *this_07;
  NonMaximumSuppression *this_08;
  FeatureVectorizer *this_09;
  Scaler *this_10;
  CustomModel *this_11;
  Identity *this_12;
  Gazetteer *this_13;
  KNearestNeighborsClassifier *this_14;
  SerializedModel *this_15;
  ItemSimilarityRecommender *this_16;
  VisionFeaturePrint *this_17;
  TreeEnsembleClassifier *this_18;
  NeuralNetwork *this_19;
  SoundAnalysisPreprocessing *this_20;
  NeuralNetworkClassifier *this_21;
  TextClassifier *this_22;
  WordTagger *this_23;
  GLMClassifier *this_24;
  SupportVectorClassifier *this_25;
  WordEmbedding *this_26;
  LinkedModel *this_27;
  BayesianProbitRegressor *this_28;
  TreeEnsembleRegressor *this_29;
  Pipeline *this_30;
  NeuralNetworkRegressor *this_31;
  GLMRegressor *this_32;
  SupportVectorRegressor *this_33;
  PipelineRegressor *this_34;
  pair<int,_int> pVar10;
  char cVar11;
  ulong uVar12;
  pair<unsigned_long,_bool> pVar13;
  
LAB_001d49da:
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar12 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar6 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar8 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
        goto LAB_001d6237;
        uVar12 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar12 = uVar12 | 0x100000000;
    }
    else {
LAB_001d6237:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar12 = 0;
      if (uVar8 - 1 < 0x5dc2) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar8 | uVar12;
    }
    uVar8 = (uint32)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto switchD_001d4b26_default;
    uVar6 = (uint)(uVar12 >> 3) & 0x1fffffff;
    cVar11 = (char)uVar12;
    if (uVar6 < 0x22c) {
      if (399 < uVar6) {
        if (uVar6 < 500) {
          switch(uVar6) {
          case 400:
            if (cVar11 == -0x7e) {
              if (this->_oneof_case_[0] == 400) {
                this_24 = (this->Type_).glmclassifier_;
              }
              else {
                clear_Type(this);
                this->_oneof_case_[0] = 400;
                this_24 = (GLMClassifier *)operator_new(0x58);
                GLMClassifier::GLMClassifier(this_24);
                (this->Type_).glmclassifier_ = this_24;
              }
              puVar4 = input->buffer_;
              if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
                input->buffer_ = puVar4 + 1;
              }
              else {
                iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
                if (iVar7 < 0) {
                  return false;
                }
              }
              pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                                 (input,iVar7);
              if ((long)pVar10 < 0) {
                return false;
              }
              bVar5 = GLMClassifier::MergePartialFromCodedStream(this_24,input);
              goto LAB_001d621e;
            }
            break;
          case 0x191:
            if (cVar11 == -0x76) {
              if (this->_oneof_case_[0] == 0x191) {
                this_25 = (this->Type_).supportvectorclassifier_;
              }
              else {
                clear_Type(this);
                this->_oneof_case_[0] = 0x191;
                this_25 = (SupportVectorClassifier *)operator_new(0xb0);
                SupportVectorClassifier::SupportVectorClassifier(this_25);
                (this->Type_).supportvectorclassifier_ = this_25;
              }
              puVar4 = input->buffer_;
              if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
                input->buffer_ = puVar4 + 1;
              }
              else {
                iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
                if (iVar7 < 0) {
                  return false;
                }
              }
              pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                                 (input,iVar7);
              if ((long)pVar10 < 0) {
                return false;
              }
              bVar5 = SupportVectorClassifier::MergePartialFromCodedStream(this_25,input);
              goto LAB_001d621e;
            }
            break;
          case 0x192:
            if (cVar11 == -0x6e) {
              if (this->_oneof_case_[0] == 0x192) {
                this_18 = (this->Type_).treeensembleclassifier_;
              }
              else {
                clear_Type(this);
                this->_oneof_case_[0] = 0x192;
                this_18 = (TreeEnsembleClassifier *)operator_new(0x30);
                TreeEnsembleClassifier::TreeEnsembleClassifier(this_18);
                (this->Type_).treeensembleclassifier_ = this_18;
              }
              puVar4 = input->buffer_;
              if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
                input->buffer_ = puVar4 + 1;
              }
              else {
                iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
                if (iVar7 < 0) {
                  return false;
                }
              }
              pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                                 (input,iVar7);
              if ((long)pVar10 < 0) {
                return false;
              }
              bVar5 = TreeEnsembleClassifier::MergePartialFromCodedStream(this_18,input);
              goto LAB_001d621e;
            }
            break;
          case 0x193:
            if (cVar11 == -0x66) {
              if (this->_oneof_case_[0] == 0x193) {
                this_21 = (this->Type_).neuralnetworkclassifier_;
              }
              else {
                clear_Type(this);
                this->_oneof_case_[0] = 0x193;
                this_21 = (NeuralNetworkClassifier *)operator_new(0x68);
                NeuralNetworkClassifier::NeuralNetworkClassifier(this_21);
                (this->Type_).neuralnetworkclassifier_ = this_21;
              }
              puVar4 = input->buffer_;
              if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
                input->buffer_ = puVar4 + 1;
              }
              else {
                iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
                if (iVar7 < 0) {
                  return false;
                }
              }
              pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                                 (input,iVar7);
              if ((long)pVar10 < 0) {
                return false;
              }
              bVar5 = NeuralNetworkClassifier::MergePartialFromCodedStream(this_21,input);
              goto LAB_001d621e;
            }
            break;
          case 0x194:
            if (cVar11 == -0x5e) {
              if (this->_oneof_case_[0] == 0x194) {
                this_14 = (this->Type_).knearestneighborsclassifier_;
              }
              else {
                clear_Type(this);
                this->_oneof_case_[0] = 0x194;
                this_14 = (KNearestNeighborsClassifier *)operator_new(0x48);
                KNearestNeighborsClassifier::KNearestNeighborsClassifier(this_14);
                (this->Type_).knearestneighborsclassifier_ = this_14;
              }
              puVar4 = input->buffer_;
              if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
                input->buffer_ = puVar4 + 1;
              }
              else {
                iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
                if (iVar7 < 0) {
                  return false;
                }
              }
              pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                                 (input,iVar7);
              if ((long)pVar10 < 0) {
                return false;
              }
              bVar5 = KNearestNeighborsClassifier::MergePartialFromCodedStream(this_14,input);
              goto LAB_001d621e;
            }
          }
          goto switchD_001d4b26_default;
        }
        if (uVar6 == 500) {
          if (cVar11 != -0x5e) goto switchD_001d4b26_default;
          if (this->_oneof_case_[0] == 500) {
            this_19 = (this->Type_).neuralnetwork_;
          }
          else {
            clear_Type(this);
            this->_oneof_case_[0] = 500;
            this_19 = (NeuralNetwork *)operator_new(0x58);
            NeuralNetwork::NeuralNetwork(this_19);
            (this->Type_).neuralnetwork_ = this_19;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar7);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar5 = NeuralNetwork::MergePartialFromCodedStream(this_19,input);
        }
        else if (uVar6 == 0x1f5) {
          if (cVar11 != -0x56) goto switchD_001d4b26_default;
          if (this->_oneof_case_[0] == 0x1f5) {
            this_16 = (this->Type_).itemsimilarityrecommender_;
          }
          else {
            clear_Type(this);
            this->_oneof_case_[0] = 0x1f5;
            this_16 = (ItemSimilarityRecommender *)operator_new(0x70);
            ItemSimilarityRecommender::ItemSimilarityRecommender(this_16);
            (this->Type_).itemsimilarityrecommender_ = this_16;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar7);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar5 = ItemSimilarityRecommender::MergePartialFromCodedStream(this_16,input);
        }
        else {
          if ((uVar6 != 0x22b) || (cVar11 != 'Z')) goto switchD_001d4b26_default;
          if (this->_oneof_case_[0] == 0x22b) {
            this_11 = (this->Type_).custommodel_;
          }
          else {
            clear_Type(this);
            this->_oneof_case_[0] = 0x22b;
            this_11 = (CustomModel *)operator_new(0x48);
            CustomModel::CustomModel(this_11);
            (this->Type_).custommodel_ = this_11;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar7);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar5 = CustomModel::MergePartialFromCodedStream(this_11,input);
        }
        goto LAB_001d621e;
      }
      if (200 < uVar6) {
        switch(uVar6) {
        case 300:
          if (cVar11 != 'b') goto switchD_001d4b26_default;
          if (this->_oneof_case_[0] == 300) {
            this_32 = (this->Type_).glmregressor_;
          }
          else {
            clear_Type(this);
            this->_oneof_case_[0] = 300;
            this_32 = (GLMRegressor *)operator_new(0x48);
            GLMRegressor::GLMRegressor(this_32);
            (this->Type_).glmregressor_ = this_32;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar7);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar5 = GLMRegressor::MergePartialFromCodedStream(this_32,input);
          break;
        case 0x12d:
          if (cVar11 != 'j') goto switchD_001d4b26_default;
          if (this->_oneof_case_[0] == 0x12d) {
            this_33 = (this->Type_).supportvectorregressor_;
          }
          else {
            clear_Type(this);
            this->_oneof_case_[0] = 0x12d;
            this_33 = (SupportVectorRegressor *)operator_new(0x38);
            SupportVectorRegressor::SupportVectorRegressor(this_33);
            (this->Type_).supportvectorregressor_ = this_33;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar7);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar5 = SupportVectorRegressor::MergePartialFromCodedStream(this_33,input);
          break;
        case 0x12e:
          if (cVar11 != 'r') goto switchD_001d4b26_default;
          if (this->_oneof_case_[0] == 0x12e) {
            this_29 = (this->Type_).treeensembleregressor_;
          }
          else {
            clear_Type(this);
            this->_oneof_case_[0] = 0x12e;
            this_29 = (TreeEnsembleRegressor *)operator_new(0x20);
            TreeEnsembleRegressor::TreeEnsembleRegressor(this_29);
            (this->Type_).treeensembleregressor_ = this_29;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar7);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar5 = TreeEnsembleRegressor::MergePartialFromCodedStream(this_29,input);
          break;
        case 0x12f:
          if (cVar11 != 'z') goto switchD_001d4b26_default;
          if (this->_oneof_case_[0] == 0x12f) {
            this_31 = (this->Type_).neuralnetworkregressor_;
          }
          else {
            clear_Type(this);
            this->_oneof_case_[0] = 0x12f;
            this_31 = (NeuralNetworkRegressor *)operator_new(0x58);
            NeuralNetworkRegressor::NeuralNetworkRegressor(this_31);
            (this->Type_).neuralnetworkregressor_ = this_31;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar7);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar5 = NeuralNetworkRegressor::MergePartialFromCodedStream(this_31,input);
          break;
        case 0x130:
          if (cVar11 != -0x7e) goto switchD_001d4b26_default;
          if (this->_oneof_case_[0] == 0x130) {
            this_28 = (this->Type_).bayesianprobitregressor_;
          }
          else {
            clear_Type(this);
            this->_oneof_case_[0] = 0x130;
            this_28 = (BayesianProbitRegressor *)operator_new(0x78);
            BayesianProbitRegressor::BayesianProbitRegressor(this_28);
            (this->Type_).bayesianprobitregressor_ = this_28;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar7);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar5 = BayesianProbitRegressor::MergePartialFromCodedStream(this_28,input);
          break;
        default:
          if (uVar6 == 0xc9) {
            if (cVar11 != 'J') goto switchD_001d4b26_default;
            if (this->_oneof_case_[0] == 0xc9) {
              this_34 = (this->Type_).pipelineregressor_;
            }
            else {
              clear_Type(this);
              this->_oneof_case_[0] = 0xc9;
              this_34 = (PipelineRegressor *)operator_new(0x20);
              PipelineRegressor::PipelineRegressor(this_34);
              (this->Type_).pipelineregressor_ = this_34;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar7);
            if ((long)pVar10 < 0) {
              return false;
            }
            bVar5 = PipelineRegressor::MergePartialFromCodedStream(this_34,input);
          }
          else {
            if ((uVar6 != 0xca) || (cVar11 != 'R')) goto switchD_001d4b26_default;
            if (this->_oneof_case_[0] == 0xca) {
              this_30 = (this->Type_).pipeline_;
            }
            else {
              clear_Type(this);
              this->_oneof_case_[0] = 0xca;
              this_30 = (Pipeline *)operator_new(0x48);
              Pipeline::Pipeline(this_30);
              (this->Type_).pipeline_ = this_30;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar7);
            if ((long)pVar10 < 0) {
              return false;
            }
            bVar5 = Pipeline::MergePartialFromCodedStream(this_30,input);
          }
        }
        goto LAB_001d621e;
      }
      if (uVar6 < 10) {
        if (uVar6 == 1) {
          if (cVar11 == '\b') {
            pbVar3 = input->buffer_;
            if (pbVar3 < input->buffer_end_) {
              bVar2 = *pbVar3;
              uVar12 = (ulong)bVar2;
              uVar8 = (uint32)bVar2;
              if ((char)bVar2 < '\0') goto LAB_001d625d;
              input->buffer_ = pbVar3 + 1;
            }
            else {
              uVar8 = 0;
LAB_001d625d:
              uVar12 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
              if ((long)uVar12 < 0) {
                return false;
              }
            }
            this->specificationversion_ = (int32)uVar12;
            goto LAB_001d49da;
          }
        }
        else if ((uVar6 == 2) && (cVar11 == '\x12')) {
          this_00 = this->description_;
          if (this_00 == (ModelDescription *)0x0) {
            this_00 = (ModelDescription *)operator_new(0x78);
            ModelDescription::ModelDescription(this_00);
            this->description_ = this_00;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar7);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar5 = ModelDescription::MergePartialFromCodedStream(this_00,input);
          goto LAB_001d621e;
        }
      }
      else if (uVar6 == 10) {
        if (cVar11 == 'P') {
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) &&
             (uVar9 = (unsigned_long)(char)*puVar4, -1 < (long)uVar9)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
            uVar9 = pVar13.first;
            if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              return false;
            }
          }
          this->isupdatable_ = uVar9 != 0;
          goto LAB_001d49da;
        }
      }
      else if ((uVar6 == 200) && (cVar11 == 'B')) {
        if (this->_oneof_case_[0] == 200) {
          this_01 = (this->Type_).pipelineclassifier_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 200;
          this_01 = (PipelineClassifier *)operator_new(0x20);
          PipelineClassifier::PipelineClassifier(this_01);
          (this->Type_).pipelineclassifier_ = this_01;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar7);
        if ((long)pVar10 < 0) {
          return false;
        }
        bVar5 = PipelineClassifier::MergePartialFromCodedStream(this_01,input);
        goto LAB_001d621e;
      }
switchD_001d4b26_default:
      if (uVar8 == 0) {
        return true;
      }
      if ((uVar8 & 7) == 4) {
        return true;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar8);
    }
    else {
      if (uVar6 < 900) {
        switch(uVar6) {
        case 600:
          if (cVar11 == -0x3e) {
            if (this->_oneof_case_[0] == 600) {
              this_06 = (this->Type_).onehotencoder_;
            }
            else {
              clear_Type(this);
              this->_oneof_case_[0] = 600;
              this_06 = (OneHotEncoder *)operator_new(0x28);
              OneHotEncoder::OneHotEncoder(this_06);
              (this->Type_).onehotencoder_ = this_06;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar7);
            if ((long)pVar10 < 0) {
              return false;
            }
            bVar5 = OneHotEncoder::MergePartialFromCodedStream(this_06,input);
            goto LAB_001d621e;
          }
          break;
        case 0x259:
          if (cVar11 == -0x36) {
            if (this->_oneof_case_[0] == 0x259) {
              this_04 = (this->Type_).imputer_;
            }
            else {
              clear_Type(this);
              this->_oneof_case_[0] = 0x259;
              this_04 = (Imputer *)operator_new(0x30);
              Imputer::Imputer(this_04);
              (this->Type_).imputer_ = this_04;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar7);
            if ((long)pVar10 < 0) {
              return false;
            }
            bVar5 = Imputer::MergePartialFromCodedStream(this_04,input);
            goto LAB_001d621e;
          }
          break;
        case 0x25a:
          if (cVar11 == -0x2e) {
            if (this->_oneof_case_[0] == 0x25a) {
              this_09 = (this->Type_).featurevectorizer_;
            }
            else {
              clear_Type(this);
              this->_oneof_case_[0] = 0x25a;
              this_09 = (FeatureVectorizer *)operator_new(0x30);
              FeatureVectorizer::FeatureVectorizer(this_09);
              (this->Type_).featurevectorizer_ = this_09;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar7);
            if ((long)pVar10 < 0) {
              return false;
            }
            bVar5 = FeatureVectorizer::MergePartialFromCodedStream(this_09,input);
            goto LAB_001d621e;
          }
          break;
        case 0x25b:
          if (cVar11 == -0x26) {
            if (this->_oneof_case_[0] == 0x25b) {
              this_03 = (this->Type_).dictvectorizer_;
            }
            else {
              clear_Type(this);
              this->_oneof_case_[0] = 0x25b;
              this_03 = (DictVectorizer *)operator_new(0x20);
              DictVectorizer::DictVectorizer(this_03);
              (this->Type_).dictvectorizer_ = this_03;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar7);
            if ((long)pVar10 < 0) {
              return false;
            }
            bVar5 = DictVectorizer::MergePartialFromCodedStream(this_03,input);
            goto LAB_001d621e;
          }
          break;
        case 0x25c:
          if (cVar11 == -0x1e) {
            if (this->_oneof_case_[0] == 0x25c) {
              this_10 = (this->Type_).scaler_;
            }
            else {
              clear_Type(this);
              this->_oneof_case_[0] = 0x25c;
              this_10 = (Scaler *)operator_new(0x40);
              Scaler::Scaler(this_10);
              (this->Type_).scaler_ = this_10;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar7);
            if ((long)pVar10 < 0) {
              return false;
            }
            bVar5 = Scaler::MergePartialFromCodedStream(this_10,input);
            goto LAB_001d621e;
          }
          break;
        case 0x25d:
        case 0x260:
          break;
        case 0x25e:
          if (cVar11 == -0xe) {
            if (this->_oneof_case_[0] == 0x25e) {
              this_07 = (this->Type_).categoricalmapping_;
            }
            else {
              clear_Type(this);
              this->_oneof_case_[0] = 0x25e;
              this_07 = (CategoricalMapping *)operator_new(0x30);
              CategoricalMapping::CategoricalMapping(this_07);
              (this->Type_).categoricalmapping_ = this_07;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar7);
            if ((long)pVar10 < 0) {
              return false;
            }
            bVar5 = CategoricalMapping::MergePartialFromCodedStream(this_07,input);
            goto LAB_001d621e;
          }
          break;
        case 0x25f:
          if (cVar11 == -6) {
            if (this->_oneof_case_[0] == 0x25f) {
              this_05 = (this->Type_).normalizer_;
            }
            else {
              clear_Type(this);
              this->_oneof_case_[0] = 0x25f;
              this_05 = (Normalizer *)operator_new(0x18);
              Normalizer::Normalizer(this_05);
              (this->Type_).normalizer_ = this_05;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar7);
            if ((long)pVar10 < 0) {
              return false;
            }
            bVar5 = Normalizer::MergePartialFromCodedStream(this_05,input);
            goto LAB_001d621e;
          }
          break;
        case 0x261:
          if (cVar11 == '\n') {
            if (this->_oneof_case_[0] == 0x261) {
              this_02 = (this->Type_).arrayfeatureextractor_;
            }
            else {
              clear_Type(this);
              this->_oneof_case_[0] = 0x261;
              this_02 = (ArrayFeatureExtractor *)operator_new(0x28);
              ArrayFeatureExtractor::ArrayFeatureExtractor(this_02);
              (this->Type_).arrayfeatureextractor_ = this_02;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar7);
            if ((long)pVar10 < 0) {
              return false;
            }
            bVar5 = ArrayFeatureExtractor::MergePartialFromCodedStream(this_02,input);
            goto LAB_001d621e;
          }
          break;
        case 0x262:
          if (cVar11 == '\x12') {
            if (this->_oneof_case_[0] == 0x262) {
              this_08 = (this->Type_).nonmaximumsuppression_;
            }
            else {
              clear_Type(this);
              this->_oneof_case_[0] = 0x262;
              this_08 = (NonMaximumSuppression *)operator_new(0x70);
              NonMaximumSuppression::NonMaximumSuppression(this_08);
              (this->Type_).nonmaximumsuppression_ = this_08;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar7);
            if ((long)pVar10 < 0) {
              return false;
            }
            bVar5 = NonMaximumSuppression::MergePartialFromCodedStream(this_08,input);
            goto LAB_001d621e;
          }
          break;
        default:
          if ((uVar6 == 0x22c) && (cVar11 == 'b')) {
            if (this->_oneof_case_[0] == 0x22c) {
              this_27 = (this->Type_).linkedmodel_;
            }
            else {
              clear_Type(this);
              this->_oneof_case_[0] = 0x22c;
              this_27 = (LinkedModel *)operator_new(0x20);
              LinkedModel::LinkedModel(this_27);
              (this->Type_).linkedmodel_ = this_27;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar7);
            if ((long)pVar10 < 0) {
              return false;
            }
            bVar5 = LinkedModel::MergePartialFromCodedStream(this_27,input);
            goto LAB_001d621e;
          }
        }
        goto switchD_001d4b26_default;
      }
      switch(uVar6) {
      case 2000:
        if (cVar11 != -0x7e) goto switchD_001d4b26_default;
        if (this->_oneof_case_[0] == 2000) {
          this_22 = (this->Type_).textclassifier_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 2000;
          this_22 = (TextClassifier *)operator_new(0x38);
          CoreMLModels::TextClassifier::TextClassifier(this_22);
          (this->Type_).textclassifier_ = this_22;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar7);
        if ((long)pVar10 < 0) {
          return false;
        }
        bVar5 = CoreMLModels::TextClassifier::MergePartialFromCodedStream(this_22,input);
        break;
      case 0x7d1:
        if (cVar11 != -0x76) goto switchD_001d4b26_default;
        if (this->_oneof_case_[0] == 0x7d1) {
          this_23 = (this->Type_).wordtagger_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 0x7d1;
          this_23 = (WordTagger *)operator_new(0x58);
          CoreMLModels::WordTagger::WordTagger(this_23);
          (this->Type_).wordtagger_ = this_23;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar7);
        if ((long)pVar10 < 0) {
          return false;
        }
        bVar5 = CoreMLModels::WordTagger::MergePartialFromCodedStream(this_23,input);
        break;
      case 0x7d2:
        if (cVar11 != -0x6e) goto switchD_001d4b26_default;
        if (this->_oneof_case_[0] == 0x7d2) {
          this_17 = (this->Type_).visionfeatureprint_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 0x7d2;
          this_17 = (VisionFeaturePrint *)operator_new(0x20);
          CoreMLModels::VisionFeaturePrint::VisionFeaturePrint(this_17);
          (this->Type_).visionfeatureprint_ = this_17;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar7);
        if ((long)pVar10 < 0) {
          return false;
        }
        bVar5 = CoreMLModels::VisionFeaturePrint::MergePartialFromCodedStream(this_17,input);
        break;
      case 0x7d3:
        if (cVar11 != -0x66) goto switchD_001d4b26_default;
        if (this->_oneof_case_[0] == 0x7d3) {
          this_20 = (this->Type_).soundanalysispreprocessing_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 0x7d3;
          this_20 = (SoundAnalysisPreprocessing *)operator_new(0x20);
          CoreMLModels::SoundAnalysisPreprocessing::SoundAnalysisPreprocessing(this_20);
          (this->Type_).soundanalysispreprocessing_ = this_20;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar7);
        if ((long)pVar10 < 0) {
          return false;
        }
        bVar5 = CoreMLModels::SoundAnalysisPreprocessing::MergePartialFromCodedStream(this_20,input)
        ;
        break;
      case 0x7d4:
        if (cVar11 != -0x5e) goto switchD_001d4b26_default;
        if (this->_oneof_case_[0] == 0x7d4) {
          this_13 = (this->Type_).gazetteer_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 0x7d4;
          this_13 = (Gazetteer *)operator_new(0x38);
          CoreMLModels::Gazetteer::Gazetteer(this_13);
          (this->Type_).gazetteer_ = this_13;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar7);
        if ((long)pVar10 < 0) {
          return false;
        }
        bVar5 = CoreMLModels::Gazetteer::MergePartialFromCodedStream(this_13,input);
        break;
      case 0x7d5:
        if (cVar11 != -0x56) goto switchD_001d4b26_default;
        if (this->_oneof_case_[0] == 0x7d5) {
          this_26 = (this->Type_).wordembedding_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 0x7d5;
          this_26 = (WordEmbedding *)operator_new(0x28);
          CoreMLModels::WordEmbedding::WordEmbedding(this_26);
          (this->Type_).wordembedding_ = this_26;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar7);
        if ((long)pVar10 < 0) {
          return false;
        }
        bVar5 = CoreMLModels::WordEmbedding::MergePartialFromCodedStream(this_26,input);
        break;
      default:
        if (uVar6 == 900) {
          if (cVar11 != '\"') goto switchD_001d4b26_default;
          if (this->_oneof_case_[0] == 900) {
            this_12 = (this->Type_).identity_;
          }
          else {
            clear_Type(this);
            this->_oneof_case_[0] = 900;
            this_12 = (Identity *)operator_new(0x18);
            Identity::Identity(this_12);
            (this->Type_).identity_ = this_12;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar7);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar5 = Identity::MergePartialFromCodedStream(this_12,input);
        }
        else {
          if ((uVar6 != 3000) || (cVar11 != -0x3e)) goto switchD_001d4b26_default;
          if (this->_oneof_case_[0] == 3000) {
            this_15 = (this->Type_).serializedmodel_;
          }
          else {
            clear_Type(this);
            this->_oneof_case_[0] = 3000;
            this_15 = (SerializedModel *)operator_new(0x28);
            SerializedModel::SerializedModel(this_15);
            (this->Type_).serializedmodel_ = this_15;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar7);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar5 = SerializedModel::MergePartialFromCodedStream(this_15,input);
        }
      }
LAB_001d621e:
      if (bVar5 == false) {
        return false;
      }
      bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar10.first);
    }
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool Model::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Model)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(24002u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int32 specificationVersion = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &specificationversion_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ModelDescription description = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_description()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool isUpdatable = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &isupdatable_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.PipelineClassifier pipelineClassifier = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_pipelineclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.PipelineRegressor pipelineRegressor = 201;
      case 201: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1610u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_pipelineregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Pipeline pipeline = 202;
      case 202: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1618u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_pipeline()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.GLMRegressor glmRegressor = 300;
      case 300: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2402u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_glmregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SupportVectorRegressor supportVectorRegressor = 301;
      case 301: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2410u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_supportvectorregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.TreeEnsembleRegressor treeEnsembleRegressor = 302;
      case 302: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2418u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_treeensembleregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetworkRegressor neuralNetworkRegressor = 303;
      case 303: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2426u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_neuralnetworkregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.BayesianProbitRegressor bayesianProbitRegressor = 304;
      case 304: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2434u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bayesianprobitregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.GLMClassifier glmClassifier = 400;
      case 400: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3202u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_glmclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SupportVectorClassifier supportVectorClassifier = 401;
      case 401: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3210u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_supportvectorclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.TreeEnsembleClassifier treeEnsembleClassifier = 402;
      case 402: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3218u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_treeensembleclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetworkClassifier neuralNetworkClassifier = 403;
      case 403: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3226u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_neuralnetworkclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.KNearestNeighborsClassifier kNearestNeighborsClassifier = 404;
      case 404: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3234u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_knearestneighborsclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetwork neuralNetwork = 500;
      case 500: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4002u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_neuralnetwork()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ItemSimilarityRecommender itemSimilarityRecommender = 501;
      case 501: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4010u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_itemsimilarityrecommender()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CustomModel customModel = 555;
      case 555: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4442u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_custommodel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LinkedModel linkedModel = 556;
      case 556: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4450u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_linkedmodel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.OneHotEncoder oneHotEncoder = 600;
      case 600: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_onehotencoder()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Imputer imputer = 601;
      case 601: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imputer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.FeatureVectorizer featureVectorizer = 602;
      case 602: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4818u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_featurevectorizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DictVectorizer dictVectorizer = 603;
      case 603: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4826u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_dictvectorizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Scaler scaler = 604;
      case 604: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4834u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_scaler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CategoricalMapping categoricalMapping = 606;
      case 606: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4850u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_categoricalmapping()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Normalizer normalizer = 607;
      case 607: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4858u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_normalizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureExtractor arrayFeatureExtractor = 609;
      case 609: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4874u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_arrayfeatureextractor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NonMaximumSuppression nonMaximumSuppression = 610;
      case 610: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4882u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_nonmaximumsuppression()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Identity identity = 900;
      case 900: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7202u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_identity()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.TextClassifier textClassifier = 2000;
      case 2000: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16002u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_textclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.WordTagger wordTagger = 2001;
      case 2001: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16010u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_wordtagger()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.VisionFeaturePrint visionFeaturePrint = 2002;
      case 2002: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16018u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_visionfeatureprint()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing soundAnalysisPreprocessing = 2003;
      case 2003: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16026u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_soundanalysispreprocessing()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.Gazetteer gazetteer = 2004;
      case 2004: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16034u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_gazetteer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.WordEmbedding wordEmbedding = 2005;
      case 2005: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16042u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_wordembedding()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SerializedModel serializedModel = 3000;
      case 3000: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24002u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_serializedmodel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Model)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Model)
  return false;
#undef DO_
}